

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O0

bool __thiscall
llvm::DWARFUnitHeader::extract
          (DWARFUnitHeader *this,DWARFContext *Context,DWARFDataExtractor *debug_info,
          uint64_t *offset_ptr,DWARFSectionKind SectionKind,DWARFUnitIndex *Index,Entry *Entry)

{
  ulong uVar1;
  uint64_t *puVar2;
  uint64_t *this_00;
  DWARFDataExtractor *this_01;
  uint8_t uVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint16_t uVar8;
  Entry *pEVar9;
  uint64_t uVar10;
  bool bVar11;
  bool AddrSizeOK;
  bool VersionOK;
  bool LengthOK;
  uint64_t uStack_58;
  bool TypeOffsetOK;
  SectionContribution *local_50;
  SectionContribution *AbbrEntry;
  SectionContribution *UnitContrib;
  DWARFUnitIndex *Index_local;
  uint64_t *puStack_30;
  DWARFSectionKind SectionKind_local;
  uint64_t *offset_ptr_local;
  DWARFDataExtractor *debug_info_local;
  DWARFContext *Context_local;
  DWARFUnitHeader *this_local;
  
  this->Offset = *offset_ptr;
  this->IndexEntry = Entry;
  UnitContrib = (SectionContribution *)Index;
  Index_local._4_4_ = SectionKind;
  puStack_30 = offset_ptr;
  offset_ptr_local = (uint64_t *)debug_info;
  debug_info_local = (DWARFDataExtractor *)Context;
  Context_local = (DWARFContext *)this;
  if ((this->IndexEntry == (Entry *)0x0) && (Index != (DWARFUnitIndex *)0x0)) {
    pEVar9 = DWARFUnitIndex::getFromOffset(Index,(uint32_t)*offset_ptr);
    this->IndexEntry = pEVar9;
  }
  uVar10 = DWARFDataExtractor::getRelocatedValue
                     ((DWARFDataExtractor *)offset_ptr_local,4,puStack_30,(uint64_t *)0x0,
                      (Error *)0x0);
  this->Length = uVar10;
  (this->FormParams).Format = DWARF32;
  if (this->Length == 0xffffffff) {
    uVar10 = DataExtractor::getU64((DataExtractor *)offset_ptr_local,puStack_30,(Error *)0x0);
    this->Length = uVar10;
    (this->FormParams).Format = DWARF64;
  }
  uVar8 = DataExtractor::getU16((DataExtractor *)offset_ptr_local,puStack_30,(Error *)0x0);
  puVar2 = offset_ptr_local;
  (this->FormParams).Version = uVar8;
  if ((this->FormParams).Version < 5) {
    bVar4 = dwarf::FormParams::getDwarfOffsetByteSize(&this->FormParams);
    uVar10 = DWARFDataExtractor::getRelocatedValue
                       ((DWARFDataExtractor *)puVar2,(uint)bVar4,puStack_30,(uint64_t *)0x0,
                        (Error *)0x0);
    this->AbbrOffset = uVar10;
    uVar3 = DataExtractor::getU8((DataExtractor *)offset_ptr_local,puStack_30,(Error *)0x0);
    (this->FormParams).AddrSize = uVar3;
    if (Index_local._4_4_ == DW_SECT_TYPES) {
      this->UnitType = '\x02';
    }
    else {
      this->UnitType = '\x01';
    }
  }
  else {
    uVar3 = DataExtractor::getU8((DataExtractor *)offset_ptr_local,puStack_30,(Error *)0x0);
    this->UnitType = uVar3;
    uVar3 = DataExtractor::getU8((DataExtractor *)offset_ptr_local,puStack_30,(Error *)0x0);
    puVar2 = offset_ptr_local;
    (this->FormParams).AddrSize = uVar3;
    bVar4 = dwarf::FormParams::getDwarfOffsetByteSize(&this->FormParams);
    uVar10 = DWARFDataExtractor::getRelocatedValue
                       ((DWARFDataExtractor *)puVar2,(uint)bVar4,puStack_30,(uint64_t *)0x0,
                        (Error *)0x0);
    this->AbbrOffset = uVar10;
  }
  if (this->IndexEntry != (Entry *)0x0) {
    if (this->AbbrOffset != 0) {
      return false;
    }
    AbbrEntry = DWARFUnitIndex::Entry::getOffset(this->IndexEntry);
    if ((AbbrEntry == (SectionContribution *)0x0) || ((ulong)AbbrEntry->Length != this->Length + 4))
    {
      return false;
    }
    local_50 = DWARFUnitIndex::Entry::getOffset(this->IndexEntry,DW_SECT_ABBREV);
    if (local_50 == (SectionContribution *)0x0) {
      return false;
    }
    this->AbbrOffset = (ulong)local_50->Offset;
  }
  bVar5 = isTypeUnit(this);
  if (bVar5) {
    uVar10 = DataExtractor::getU64((DataExtractor *)offset_ptr_local,puStack_30,(Error *)0x0);
    this_00 = offset_ptr_local;
    puVar2 = puStack_30;
    this->TypeHash = uVar10;
    bVar4 = dwarf::FormParams::getDwarfOffsetByteSize(&this->FormParams);
    uVar10 = DataExtractor::getUnsigned((DataExtractor *)this_00,puVar2,(uint)bVar4,(Error *)0x0);
    this->TypeOffset = uVar10;
  }
  else if ((this->UnitType == '\x05') || (this->UnitType == '\x04')) {
    uStack_58 = DataExtractor::getU64((DataExtractor *)offset_ptr_local,puStack_30,(Error *)0x0);
    Optional<unsigned_long>::operator=(&this->DWOId,&stack0xffffffffffffffa8);
  }
  if (*puStack_30 - this->Offset < 0x100) {
    this->Size = (char)*puStack_30 - (char)this->Offset;
    bVar5 = isTypeUnit(this);
    if (bVar5) {
      bVar5 = false;
      if ((ulong)this->Size <= this->TypeOffset) {
        uVar1 = this->TypeOffset;
        uVar10 = getLength(this);
        bVar4 = getUnitLengthFieldByteSize(this);
        bVar5 = uVar1 < uVar10 + bVar4;
      }
    }
    else {
      bVar5 = true;
    }
    puVar2 = offset_ptr_local;
    uVar10 = getNextUnitOffset(this);
    bVar6 = DataExtractor::isValidOffset((DataExtractor *)puVar2,uVar10 - 1);
    uVar8 = getVersion(this);
    bVar7 = DWARFContext::isSupportedVersion((uint)uVar8);
    uVar3 = getAddressByteSize(this);
    bVar11 = true;
    if (uVar3 != '\x04') {
      uVar3 = getAddressByteSize(this);
      bVar11 = uVar3 == '\b';
    }
    this_01 = debug_info_local;
    if ((((bVar6) && (bVar7)) && (bVar11)) && (bVar5)) {
      uVar8 = getVersion(this);
      DWARFContext::setMaxVersionIfGreater((DWARFContext *)this_01,(uint)uVar8);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
    return this_local._7_1_;
  }
  __assert_fail("*offset_ptr - Offset <= 255 && \"unexpected header size\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFUnit.cpp"
                ,0x11c,
                "bool llvm::DWARFUnitHeader::extract(DWARFContext &, const DWARFDataExtractor &, uint64_t *, DWARFSectionKind, const DWARFUnitIndex *, const DWARFUnitIndex::Entry *)"
               );
}

Assistant:

bool DWARFUnitHeader::extract(DWARFContext &Context,
                              const DWARFDataExtractor &debug_info,
                              uint64_t *offset_ptr,
                              DWARFSectionKind SectionKind,
                              const DWARFUnitIndex *Index,
                              const DWARFUnitIndex::Entry *Entry) {
  Offset = *offset_ptr;
  IndexEntry = Entry;
  if (!IndexEntry && Index)
    IndexEntry = Index->getFromOffset(*offset_ptr);
  Length = debug_info.getRelocatedValue(4, offset_ptr);
  FormParams.Format = DWARF32;
  if (Length == dwarf::DW_LENGTH_DWARF64) {
    Length = debug_info.getU64(offset_ptr);
    FormParams.Format = DWARF64;
  }
  FormParams.Version = debug_info.getU16(offset_ptr);
  if (FormParams.Version >= 5) {
    UnitType = debug_info.getU8(offset_ptr);
    FormParams.AddrSize = debug_info.getU8(offset_ptr);
    AbbrOffset = debug_info.getRelocatedValue(FormParams.getDwarfOffsetByteSize(), offset_ptr);
  } else {
    AbbrOffset = debug_info.getRelocatedValue(FormParams.getDwarfOffsetByteSize(), offset_ptr);
    FormParams.AddrSize = debug_info.getU8(offset_ptr);
    // Fake a unit type based on the section type.  This isn't perfect,
    // but distinguishing compile and type units is generally enough.
    if (SectionKind == DW_SECT_TYPES)
      UnitType = DW_UT_type;
    else
      UnitType = DW_UT_compile;
  }
  if (IndexEntry) {
    if (AbbrOffset)
      return false;
    auto *UnitContrib = IndexEntry->getOffset();
    if (!UnitContrib || UnitContrib->Length != (Length + 4))
      return false;
    auto *AbbrEntry = IndexEntry->getOffset(DW_SECT_ABBREV);
    if (!AbbrEntry)
      return false;
    AbbrOffset = AbbrEntry->Offset;
  }
  if (isTypeUnit()) {
    TypeHash = debug_info.getU64(offset_ptr);
    TypeOffset =
        debug_info.getUnsigned(offset_ptr, FormParams.getDwarfOffsetByteSize());
  } else if (UnitType == DW_UT_split_compile || UnitType == DW_UT_skeleton)
    DWOId = debug_info.getU64(offset_ptr);

  // Header fields all parsed, capture the size of this unit header.
  assert(*offset_ptr - Offset <= 255 && "unexpected header size");
  Size = uint8_t(*offset_ptr - Offset);

  // Type offset is unit-relative; should be after the header and before
  // the end of the current unit.
  bool TypeOffsetOK =
      !isTypeUnit()
          ? true
          : TypeOffset >= Size &&
                TypeOffset < getLength() + getUnitLengthFieldByteSize();
  bool LengthOK = debug_info.isValidOffset(getNextUnitOffset() - 1);
  bool VersionOK = DWARFContext::isSupportedVersion(getVersion());
  bool AddrSizeOK = getAddressByteSize() == 4 || getAddressByteSize() == 8;

  if (!LengthOK || !VersionOK || !AddrSizeOK || !TypeOffsetOK)
    return false;

  // Keep track of the highest DWARF version we encounter across all units.
  Context.setMaxVersionIfGreater(getVersion());
  return true;
}